

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

CompatibilityTestType __thiscall deqp::gls::DrawTestSpec::isCompatibilityTest(DrawTestSpec *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  MethodInfo MVar4;
  size_type sVar5;
  const_reference pvVar6;
  int local_2c;
  int local_28;
  int indexSize;
  int ndx_1;
  int ndx;
  bool strideAlignmentBad;
  bool bufferAlignmentBad;
  MethodInfo methodInfo;
  DrawTestSpec *this_local;
  
  MVar4 = anon_unknown_1::getMethodInfo(this->drawMethod);
  bVar1 = false;
  bVar2 = false;
  for (indexSize = 0;
      sVar5 = std::
              vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
              ::size(&this->attribs), indexSize < (int)sVar5; indexSize = indexSize + 1) {
    pvVar6 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[](&this->attribs,(long)indexSize);
    bVar3 = AttributeSpec::isBufferAligned(pvVar6);
    if (!bVar3) {
      bVar1 = true;
    }
  }
  for (local_28 = 0;
      sVar5 = std::
              vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
              ::size(&this->attribs), local_28 < (int)sVar5; local_28 = local_28 + 1) {
    pvVar6 = std::
             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ::operator[](&this->attribs,(long)local_28);
    bVar3 = AttributeSpec::isBufferStrideAligned(pvVar6);
    if (!bVar3) {
      bVar2 = true;
    }
  }
  if ((((uint6)MVar4 & 1) != 0) && (this->indexStorage == STORAGE_BUFFER)) {
    local_2c = 0;
    if (this->indexType == INDEXTYPE_BYTE) {
      local_2c = 1;
    }
    else if (this->indexType == INDEXTYPE_SHORT) {
      local_2c = 2;
    }
    else if (this->indexType == INDEXTYPE_INT) {
      local_2c = 4;
    }
    if (this->indexPointerOffset % local_2c != 0) {
      bVar1 = true;
    }
  }
  if (bVar1) {
    this_local._4_4_ = COMPATIBILITY_UNALIGNED_OFFSET;
  }
  else if (bVar2) {
    this_local._4_4_ = COMPATIBILITY_UNALIGNED_STRIDE;
  }
  else {
    this_local._4_4_ = COMPATIBILITY_NONE;
  }
  return this_local._4_4_;
}

Assistant:

DrawTestSpec::CompatibilityTestType DrawTestSpec::isCompatibilityTest (void) const
{
	const MethodInfo methodInfo = getMethodInfo(drawMethod);

	bool bufferAlignmentBad = false;
	bool strideAlignmentBad = false;

	// Attribute buffer alignment
	for (int ndx = 0; ndx < (int)attribs.size(); ++ndx)
		if (!attribs[ndx].isBufferAligned())
			bufferAlignmentBad = true;

	// Attribute stride alignment
	for (int ndx = 0; ndx < (int)attribs.size(); ++ndx)
		if (!attribs[ndx].isBufferStrideAligned())
			strideAlignmentBad = true;

	// Index buffer alignment
	if (methodInfo.indexed)
	{
		if (indexStorage == STORAGE_BUFFER)
		{
			int indexSize = 0;
			if (indexType == INDEXTYPE_BYTE)
				indexSize = 1;
			else if (indexType == INDEXTYPE_SHORT)
				indexSize = 2;
			else if (indexType == INDEXTYPE_INT)
				indexSize = 4;
			else
				DE_ASSERT(DE_FALSE);

			if (indexPointerOffset % indexSize != 0)
				bufferAlignmentBad = true;
		}
	}

	// \note combination bad alignment & stride is treated as bad offset
	if (bufferAlignmentBad)
		return COMPATIBILITY_UNALIGNED_OFFSET;
	else if (strideAlignmentBad)
		return COMPATIBILITY_UNALIGNED_STRIDE;
	else
		return COMPATIBILITY_NONE;
}